

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RunContext::handleNonExpr
          (RunContext *this,AssertionInfo *info,OfType resultType,AssertionReaction *reaction)

{
  char *pcVar1;
  size_type sVar2;
  char *pcVar3;
  size_t sVar4;
  size_type sVar5;
  AssertionResult assertionResult;
  AssertionResultData data;
  AssertionResult AStack_118;
  AssertionResultData local_88;
  
  (this->m_lastAssertionInfo).resultDisposition = info->resultDisposition;
  pcVar1 = (info->macroName).m_start;
  sVar2 = (info->macroName).m_size;
  pcVar3 = (info->lineInfo).file;
  sVar4 = (info->lineInfo).line;
  sVar5 = (info->capturedExpression).m_size;
  (this->m_lastAssertionInfo).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_lastAssertionInfo).capturedExpression.m_size = sVar5;
  (this->m_lastAssertionInfo).lineInfo.file = pcVar3;
  (this->m_lastAssertionInfo).lineInfo.line = sVar4;
  (this->m_lastAssertionInfo).macroName.m_start = pcVar1;
  (this->m_lastAssertionInfo).macroName.m_size = sVar2;
  LazyExpression::LazyExpression((LazyExpression *)&AStack_118,false);
  AssertionResultData::AssertionResultData(&local_88,resultType,(LazyExpression *)&AStack_118);
  AssertionResult::AssertionResult(&AStack_118,info,&local_88);
  assertionEnded(this,&AStack_118);
  if ((((undefined1)AStack_118.m_resultData.resultType & FailureBit) != Ok) &&
     ((AStack_118.m_info.resultDisposition & SuppressFail) == 0)) {
    populateReaction(this,reaction);
  }
  AssertionResultData::~AssertionResultData(&AStack_118.m_resultData);
  AssertionResultData::~AssertionResultData(&local_88);
  return;
}

Assistant:

void RunContext::handleNonExpr(
            AssertionInfo const &info,
            ResultWas::OfType resultType,
            AssertionReaction &reaction
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data( resultType, LazyExpression( false ) );
        AssertionResult assertionResult{ info, data };
        assertionEnded( assertionResult );

        if( !assertionResult.isOk() )
            populateReaction( reaction );
    }